

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void brotli::RunLengthCodeZeros
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v_in,
               uint32_t *max_run_length_prefix,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v_out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *extra_bits)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  size_t i;
  uint32_t run_length_prefix;
  uint local_48;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  uint32_t *local_38;
  
  puVar2 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar1 - (long)puVar2 >> 2;
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar9 = (uint)uVar5;
    if (uVar4 <= uVar6) {
      local_48 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> local_48 == 0; local_48 = local_48 - 1) {
        }
      }
      if (uVar9 == 0) {
        local_48 = 0;
      }
      if (*max_run_length_prefix < local_48) {
        local_48 = *max_run_length_prefix;
      }
      *max_run_length_prefix = local_48;
      uVar6 = 0;
      local_40 = v_in;
      local_38 = max_run_length_prefix;
      while( true ) {
        uVar4 = (long)puVar1 - (long)puVar2 >> 2;
        if (uVar4 <= uVar6) {
          return;
        }
        if (puVar2[uVar6] == 0) break;
        run_length_prefix = puVar2[uVar6] + *local_38;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (v_out,&run_length_prefix);
        run_length_prefix = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (extra_bits,&run_length_prefix);
        uVar6 = uVar6 + 1;
LAB_0017453f:
        puVar2 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar9 = (int)uVar4 - (int)uVar6;
      for (lVar3 = 1; uVar6 + lVar3 < uVar4; lVar3 = lVar3 + 1) {
        if (puVar2[uVar6 + lVar3] != 0) {
          uVar9 = (uint)lVar3;
          break;
        }
      }
      uVar6 = uVar6 + uVar9;
LAB_001744bf:
      v_in = local_40;
      if (uVar9 != 0) {
        if ((uint)(2 << ((byte)local_48 & 0x1f)) <= uVar9) break;
        run_length_prefix = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> run_length_prefix == 0; run_length_prefix = run_length_prefix - 1) {
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (v_out,&run_length_prefix);
        local_44 = (-1 << ((byte)run_length_prefix & 0x1f)) + uVar9;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (extra_bits,&local_44);
        v_in = local_40;
      }
      goto LAB_0017453f;
    }
    for (; (uVar7 = uVar4, uVar4 != uVar6 && (uVar7 = uVar6, puVar2[uVar6] != 0)); uVar6 = uVar6 + 1
        ) {
    }
    uVar6 = uVar4;
    if (uVar4 < uVar7) {
      uVar6 = uVar7;
    }
    for (uVar8 = 0; uVar6 - uVar7 != uVar8; uVar8 = uVar8 + 1) {
      if (puVar2[uVar7 + uVar8] != 0) {
        uVar6 = uVar7 + uVar8;
        break;
      }
    }
    if (uVar9 < (uint)uVar8) {
      uVar5 = uVar8 & 0xffffffff;
    }
  } while( true );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(v_out,&local_48);
  run_length_prefix = ~(-1 << ((byte)local_48 & 0x1f));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (extra_bits,&run_length_prefix);
  uVar9 = uVar9 + (-2 << ((byte)local_48 & 0x1f)) + 1;
  goto LAB_001744bf;
}

Assistant:

void RunLengthCodeZeros(const std::vector<uint32_t>& v_in,
                        uint32_t* max_run_length_prefix,
                        std::vector<uint32_t>* v_out,
                        std::vector<uint32_t>* extra_bits) {
  uint32_t max_reps = 0;
  for (size_t i = 0; i < v_in.size();) {
    for (; i < v_in.size() && v_in[i] != 0; ++i) ;
    uint32_t reps = 0;
    for (; i < v_in.size() && v_in[i] == 0; ++i) {
      ++reps;
    }
    max_reps = std::max(reps, max_reps);
  }
  uint32_t max_prefix = max_reps > 0 ? Log2FloorNonZero(max_reps) : 0;
  max_prefix = std::min(max_prefix, *max_run_length_prefix);
  *max_run_length_prefix = max_prefix;
  for (size_t i = 0; i < v_in.size();) {
    if (v_in[i] != 0) {
      v_out->push_back(v_in[i] + *max_run_length_prefix);
      extra_bits->push_back(0);
      ++i;
    } else {
      uint32_t reps = 1;
      for (size_t k = i + 1; k < v_in.size() && v_in[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      while (reps != 0) {
        if (reps < (2u << max_prefix)) {
          uint32_t run_length_prefix = Log2FloorNonZero(reps);
          v_out->push_back(run_length_prefix);
          extra_bits->push_back(reps - (1u << run_length_prefix));
          break;
        } else {
          v_out->push_back(max_prefix);
          extra_bits->push_back((1u << max_prefix) - 1u);
          reps -= (2u << max_prefix) - 1u;
        }
      }
    }
  }
}